

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

void trimLine(void)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(inputBuffer);
  if (1 < (int)(uint)sVar1) {
    uVar2 = (ulong)((uint)sVar1 & 0x7fffffff) + 1;
    do {
      if (0x20 < (ulong)(byte)(&DAT_001111ce)[uVar2]) {
        return;
      }
      if ((0x100000600U >> ((ulong)(byte)(&DAT_001111ce)[uVar2] & 0x3f) & 1) == 0) {
        return;
      }
      (&DAT_001111ce)[uVar2] = 0;
      uVar2 = uVar2 - 1;
    } while (2 < uVar2);
  }
  return;
}

Assistant:

void trimLine()
{
    int index = (int)strlen(inputBuffer) - 1;

    while(index > 0) {
        if((inputBuffer[index] == ' ') || (inputBuffer[index] == '\t') || (inputBuffer[index] == '\n')) {
            inputBuffer[index--] = 0;
        } else {
            break;
        }
    }
}